

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O3

int tag_label(mdl_t *mdl,FILE *fin,FILE *fout)

{
  long *plVar1;
  undefined8 uVar2;
  _Bool _Var3;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  rdr_t *prVar7;
  opt_t *poVar8;
  raw_t rVar9;
  double dVar10;
  long lVar11;
  uint32_t **ppuVar12;
  int iVar13;
  raw_t *prVar14;
  seq_t *psVar15;
  double **ppdVar16;
  double *pdVar17;
  ulong uVar18;
  char *pcVar19;
  long lVar20;
  uint32_t y;
  uint64_t id;
  byte bVar21;
  size_t sVar22;
  size_t size;
  ulong uVar23;
  qrk_t *qrk;
  long lVar24;
  long lVar25;
  uint32_t N;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined4 uVar33;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  double dVar40;
  undefined1 auVar39 [16];
  undefined8 uStack_100;
  qrk_t *local_f8;
  FILE *local_f0;
  long local_e8;
  size_t local_e0;
  long local_d8;
  long local_d0;
  mdl_t *local_c8;
  double dStack_c0;
  undefined1 local_b8 [16];
  ulong local_a8;
  raw_t *local_a0;
  double *local_98;
  long local_90;
  uint64_t local_88;
  long local_80;
  long local_78;
  long local_70;
  undefined1 local_68 [16];
  ulong local_58;
  seq_t *local_50;
  long local_48;
  uint32_t **local_40;
  double **local_38;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar34 [16];
  
  prVar7 = mdl->reader;
  uVar18 = (ulong)mdl->nlbl;
  poVar8 = mdl->opt;
  lVar11 = -(uVar18 * 0x18 + 0xf & 0xfffffffffffffff0);
  lVar24 = (long)&local_f8 + lVar11;
  if (uVar18 != 0) {
    uVar23 = 0;
    do {
      *(undefined8 *)(uVar18 * 0x10 + lVar24 + uVar23 * 8) = 0;
      *(undefined8 *)(lVar24 + uVar18 * 8 + uVar23 * 8) = 0;
      *(undefined8 *)(lVar24 + uVar23 * 8) = 0;
      uVar23 = uVar23 + 1;
    } while (uVar18 != uVar23);
  }
  uVar23 = (ulong)poVar8->nbest;
  qrk = prVar7->lbl;
  local_88 = uVar18;
  local_70 = lVar24;
  *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107bcd;
  iVar13 = feof((FILE *)fin);
  if (iVar13 == 0) {
    local_e8 = uVar23 * 4;
    local_e0 = uVar23 * 8;
    local_d8 = local_70 + local_88 * 8;
    local_d0 = local_88 * 0x10 + local_70;
    local_78 = 0;
    local_90 = 0;
    local_48 = 0;
    local_80 = 0;
    local_f8 = qrk;
    local_f0 = (FILE *)fin;
    local_c8 = mdl;
    local_a8 = uVar23;
    local_68._0_8_ = fout;
    do {
      prVar7 = mdl->reader;
      *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107c73;
      prVar14 = rdr_readraw(prVar7,fin);
      if (prVar14 == (raw_t *)0x0) break;
      prVar7 = mdl->reader;
      _Var3 = mdl->opt->force;
      _Var4 = mdl->opt->check;
      local_a0 = prVar14;
      *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107ca3;
      psVar15 = rdr_raw2seq(prVar7,prVar14,(_Bool)(_Var3 | _Var4));
      prVar14 = local_a0;
      if (psVar15 == (seq_t *)0x0) {
        *(undefined8 *)((long)&uStack_100 + lVar11) = 0x1082a9;
        rdr_freeraw(prVar14);
        return 0;
      }
      uVar18 = CONCAT44(0,psVar15->len);
      sVar22 = local_e8 * uVar18;
      local_50 = psVar15;
      *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107cc3;
      local_40 = (uint32_t **)xmalloc(sVar22);
      sVar22 = local_e0;
      local_b8._0_8_ = uVar18;
      size = local_e0 * uVar18;
      *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107ce1;
      ppdVar16 = (double **)xmalloc(size);
      *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107cec;
      pdVar17 = (double *)xmalloc(sVar22);
      ppuVar12 = local_40;
      psVar15 = local_50;
      uVar18 = local_a8;
      N = (uint32_t)local_a8;
      local_98 = pdVar17;
      local_38 = ppdVar16;
      if (N == 1) {
        *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107d1d;
        tag_viterbi(mdl,psVar15,(uint32_t *)ppuVar12,pdVar17,(double *)ppdVar16);
LAB_00107d3b:
        local_58 = 0;
        do {
          if (mdl->opt->outsc == true) {
            dVar40 = local_98[local_58];
            *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107d71;
            fprintf((FILE *)fout,"# %d %f\n",SUB84(dVar40,0));
          }
          if (local_b8._0_8_ != 0) {
            uVar23 = local_58 & 0xffffffff;
            lVar24 = 0;
            do {
              uVar2 = local_68._0_8_;
              if (mdl->opt->label == false) {
                rVar9 = local_a0[lVar24 + 1];
                *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107db3;
                fprintf((FILE *)uVar2,"%s\t",rVar9);
              }
              uVar5 = *(uint *)((long)local_40 + uVar23 * 4);
              *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107dc6;
              pcVar19 = qrk_id2str(qrk,(ulong)uVar5);
              uVar2 = local_68._0_8_;
              *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107dd8;
              fputs(pcVar19,(FILE *)uVar2);
              if (local_c8->opt->outsc == true) {
                *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107dff;
                fprintf((FILE *)uVar2,"\t%s",pcVar19);
                pdVar17 = local_38[uVar23];
                *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107e1a;
                fprintf((FILE *)uVar2,"/%f",(int)pdVar17);
              }
              *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107e27;
              fputc(10,(FILE *)uVar2);
              lVar24 = lVar24 + 1;
              uVar23 = (ulong)(uint)((int)uVar23 + (int)local_a8);
              mdl = local_c8;
              qrk = local_f8;
              uVar18 = local_a8;
            } while (local_b8._0_8_ != lVar24);
          }
          fout = (FILE *)local_68._0_8_;
          *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107e60;
          fputc(10,(FILE *)fout);
          local_58 = local_58 + 1;
        } while (local_58 != uVar18);
      }
      else {
        *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107d32;
        tag_nbviterbi(mdl,psVar15,N,ppuVar12,pdVar17,ppdVar16);
        if (uVar18 != 0) goto LAB_00107d3b;
      }
      *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107e7c;
      fflush((FILE *)fout);
      ppdVar16 = local_38;
      lVar24 = local_48;
      pdVar17 = local_98;
      if (mdl->opt->check == true) {
        if (local_b8._0_8_ == 0) {
          uVar18 = 0;
        }
        else {
          lVar20 = 0;
          uVar18 = 0;
          bVar21 = 0;
          do {
            uVar5 = *(uint *)((long)&local_50[1].len + lVar20);
            if ((ulong)uVar5 != 0xffffffff) {
              plVar1 = (long *)(local_70 + (ulong)uVar5 * 8);
              *plVar1 = *plVar1 + 1;
              uVar6 = *(uint *)((long)local_40 + uVar18 * 4);
              plVar1 = (long *)(local_d8 + (ulong)uVar6 * 8);
              *plVar1 = *plVar1 + 1;
              if (uVar5 == uVar6) {
                plVar1 = (long *)(local_d0 + (ulong)uVar6 * 8);
                *plVar1 = *plVar1 + 1;
              }
              else {
                local_90 = local_90 + 1;
                bVar21 = 1;
              }
            }
            uVar18 = (ulong)(uint)((int)uVar18 + (int)local_a8);
            lVar20 = lVar20 + 0x20;
          } while (local_b8._0_8_ << 5 != lVar20);
          uVar18 = (ulong)bVar21;
        }
        local_78 = local_78 + local_b8._0_8_;
        local_80 = local_80 + uVar18;
      }
      *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107f43;
      free(pdVar17);
      *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107f4b;
      free(ppdVar16);
      ppuVar12 = local_40;
      *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107f54;
      free(ppuVar12);
      psVar15 = local_50;
      *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107f5d;
      rdr_freeseq(psVar15);
      prVar14 = local_a0;
      *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107f69;
      rdr_freeraw(prVar14);
      lVar24 = lVar24 + 1;
      if (((ulong)(lVar24 * 0x1cac083126e978d5) >> 3 | lVar24 * 0x1cac083126e978d5 << 0x3d) <
          0x4189374bc6a7f0) {
        *(undefined8 *)((long)&uStack_100 + lVar11) = 0x107fa5;
        info("%10lu sequences labeled",lVar24);
        if (mdl->opt->check == true) {
          auVar28._8_4_ = (int)((ulong)local_90 >> 0x20);
          auVar28._0_8_ = local_90;
          auVar28._12_4_ = 0x45300000;
          uVar26 = (undefined4)local_90;
          auVar29._8_4_ = (int)((ulong)local_78 >> 0x20);
          auVar29._0_8_ = local_78;
          auVar29._12_4_ = 0x45300000;
          uVar27 = (undefined4)local_78;
          auVar34._8_4_ = (int)((ulong)local_80 >> 0x20);
          auVar34._0_8_ = local_80;
          auVar34._12_4_ = 0x45300000;
          uVar33 = (undefined4)local_80;
          auVar35._8_4_ = (int)((ulong)lVar24 >> 0x20);
          auVar35._0_8_ = lVar24;
          auVar35._12_4_ = 0x45300000;
          *(undefined8 *)((long)&uStack_100 + lVar11) = 0x108050;
          info("\t%5.2f%%/%5.2f%%",
               SUB84((((auVar28._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar26) - 4503599627370496.0)) /
                     ((auVar29._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,uVar27) - 4503599627370496.0))) * 100.0,0),
               (((auVar34._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,uVar33) - 4503599627370496.0)) /
               ((auVar35._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0))) * 100.0);
        }
        *(undefined8 *)((long)&uStack_100 + lVar11) = 0x10805e;
        info("\n");
      }
      fin = (FILE *)local_f0;
      local_48 = lVar24;
      *(undefined8 *)((long)&uStack_100 + lVar11) = 0x108071;
      iVar13 = feof((FILE *)fin);
    } while (iVar13 == 0);
    local_68._8_8_ =
         (double)CONCAT44(0x45300000,(int)((ulong)local_90 >> 0x20)) - 1.9342813113834067e+25;
    dVar10 = (double)local_68._8_8_ +
             ((double)CONCAT44(0x43300000,(int)local_90) - 4503599627370496.0);
    auVar30._8_4_ = (int)((ulong)local_78 >> 0x20);
    auVar30._0_8_ = local_78;
    auVar30._12_4_ = 0x45300000;
    dVar40 = (auVar30._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0);
    auVar31._8_4_ = (int)((ulong)local_80 >> 0x20);
    auVar31._0_8_ = local_80;
    auVar31._12_4_ = 0x45300000;
    dStack_c0 = auVar31._8_8_ - 1.9342813113834067e+25;
    dVar37 = dStack_c0 + ((double)CONCAT44(0x43300000,(int)local_80) - 4503599627370496.0);
    lVar24 = local_48;
  }
  else {
    dVar37 = 0.0;
    dStack_c0 = 0.0;
    dVar10 = 0.0;
    local_68._8_8_ = 0.0;
    dVar40 = 0.0;
    lVar24 = 0;
  }
  if (mdl->opt->check == true) {
    auVar32._8_4_ = (int)((ulong)lVar24 >> 0x20);
    auVar32._0_8_ = lVar24;
    auVar32._12_4_ = 0x45300000;
    local_68._0_8_ = (dVar10 / dVar40) * 100.0;
    local_c8 = (mdl_t *)((dVar37 / ((auVar32._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0)))
                        * 100.0);
    *(undefined8 *)((long)&uStack_100 + lVar11) = 0x108142;
    info("    Nb sequences  : %lu\n");
    uVar26 = local_68._0_4_;
    *(undefined8 *)((long)&uStack_100 + lVar11) = 0x108154;
    info("    Token error   : %5.2f%%\n",uVar26);
    uVar26 = local_c8._0_4_;
    *(undefined8 *)((long)&uStack_100 + lVar11) = 0x10816a;
    info("    Sequence error: %5.2f%%\n",uVar26);
    *(undefined8 *)((long)&uStack_100 + lVar11) = 0x108178;
    info("* Per label statistics\n");
    lVar24 = local_70;
    if (local_88 != 0) {
      lVar25 = local_88 * 0x10 + local_70;
      lVar20 = local_70 + local_88 * 8;
      id = 0;
      do {
        *(undefined8 *)((long)&uStack_100 + lVar11) = 0x1081a4;
        pcVar19 = qrk_id2str(qrk,id);
        uVar2 = *(undefined8 *)(lVar25 + id * 8);
        auVar38._0_8_ = (double)CONCAT44(0x43300000,(int)uVar2);
        auVar38._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar38._12_4_ = 0x45300000;
        dVar40 = auVar38._8_8_ - 1.9342813113834067e+25;
        uVar18 = *(ulong *)(lVar20 + id * 8);
        uVar23 = *(ulong *)(lVar24 + id * 8);
        auVar36._0_8_ =
             ((double)(uVar23 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar23 & 0xffffffff | 0x4330000000000000);
        auVar36._8_8_ =
             ((double)(uVar18 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar18 & 0xffffffff | 0x4330000000000000);
        auVar39._0_8_ = (auVar38._0_8_ - 4503599627370496.0) + dVar40;
        auVar39._8_8_ = (auVar38._0_8_ - 4503599627370496.0) + dVar40;
        local_68 = divpd(auVar39,auVar36);
        dStack_c0 = local_68._8_8_;
        local_b8._8_4_ = local_68._8_4_;
        local_b8._0_8_ = dStack_c0;
        local_b8._12_4_ = local_68._12_4_;
        dVar40 = local_68._0_8_ * dStack_c0;
        local_c8 = (mdl_t *)((dVar40 + dVar40) / (dStack_c0 + local_68._0_8_));
        *(undefined8 *)((long)&uStack_100 + lVar11) = 0x10824c;
        info("    %-6s",pcVar19);
        uVar26 = local_b8._0_4_;
        *(undefined8 *)((long)&uStack_100 + lVar11) = 0x108261;
        info("  Pr=%.2f",uVar26);
        uVar26 = local_68._0_4_;
        *(undefined8 *)((long)&uStack_100 + lVar11) = 0x108273;
        info("  Rc=%.2f",uVar26);
        uVar26 = local_c8._0_4_;
        *(undefined8 *)((long)&uStack_100 + lVar11) = 0x108289;
        info("  F1=%.2f\n",uVar26);
        id = id + 1;
      } while (id != local_88);
    }
  }
  return 1;
}

Assistant:

int tag_label(mdl_t *mdl, FILE *fin, FILE *fout) {
	qrk_t *lbls = mdl->reader->lbl;
	const uint32_t Y = mdl->nlbl;
	const uint32_t N = mdl->opt->nbest;
	// We start by preparing the statistic collection to be ready if check
	// option is used. The stat array hold the following for each label
	//   [0] # of reference with this label
	//   [1] # of token we have taged with this label
	//   [2] # of match of the two preceding
	uint64_t tcnt = 0, terr = 0;
	uint64_t scnt = 0, serr = 0;
	uint64_t stat[3][Y];
	for (uint32_t y = 0; y < Y; y++)
		stat[0][y] = stat[1][y] = stat[2][y] = 0;
	// Next read the input file sequence by sequence and label them, we have
	// to take care of not discarding the raw input as we want to send it
	// back to the output with the additional predicted labels.
	while (!feof(fin)) {
		// So, first read an input sequence keeping the raw_t object
		// available, and label it with Viterbi.
		raw_t *raw = rdr_readraw(mdl->reader, fin);
		if (raw == NULL)
			break;
		seq_t *seq = rdr_raw2seq(mdl->reader, raw,
			mdl->opt->check | mdl->opt->force);
        if (seq == NULL) {
            rdr_freeraw(raw);
            return 0;
        }
		const uint32_t T = seq->len;
		uint32_t *out = xmalloc(sizeof(uint32_t) * T * N);
		double   *psc = xmalloc(sizeof(double  ) * T * N);
		double   *scs = xmalloc(sizeof(double  ) * N);
		if (N == 1)
			tag_viterbi(mdl, seq, (uint32_t*)out, scs, (double*)psc);
		else
			tag_nbviterbi(mdl, seq, N, (void*)out, scs, (void*)psc);
		// Next we output the raw sequence with an aditional column for
		// the predicted labels
		for (uint32_t n = 0; n < N; n++) {
			if (mdl->opt->outsc)
				fprintf(fout, "# %d %f\n", (int)n, scs[n]);
			for (uint32_t t = 0; t < T; t++) {
				if (!mdl->opt->label)
					fprintf(fout, "%s\t", raw->lines[t]);
				uint32_t lbl = out[t * N + n];
				const char *lblstr = qrk_id2str(lbls, lbl);
				fprintf(fout, "%s", lblstr);
				if (mdl->opt->outsc) {
					fprintf(fout, "\t%s", lblstr);
					fprintf(fout, "/%f", psc[t * N + n]);
				}
				fprintf(fout, "\n");
			}
			fprintf(fout, "\n");
		}
		fflush(fout);
		// If user provided reference labels, use them to collect
		// statistics about how well we have performed here. Labels
		// unseen at training time are discarded.
		if (mdl->opt->check) {
			bool err = false;
			for (uint32_t t = 0; t < T; t++) {
				if (seq->pos[t].lbl == (uint32_t)-1)
					continue;
				stat[0][seq->pos[t].lbl]++;
				stat[1][out[t * N]]++;
				if (seq->pos[t].lbl != out[t * N])
					terr++, err = true;
				else
					stat[2][out[t * N]]++;
			}
			tcnt += T;
			serr += err;
		}
		// Cleanup memory used for this sequence
		free(scs);
		free(psc);
		free(out);
		rdr_freeseq(seq);
		rdr_freeraw(raw);
		// And report our progress, at regular interval we display how
		// much sequence are labelled and if possible the current tokens
		// and sequence error rates.
		if (++scnt % 1000 == 0) {
			info("%10"PRIu64" sequences labeled", scnt);
			if (mdl->opt->check) {
				const double te = (double)terr  / tcnt * 100.0;
				const double se = (double)serr  / scnt * 100.0;
				info("\t%5.2f%%/%5.2f%%", te, se);
			}
			info("\n");
		}
	}
	// If user have provided reference labels, we have collected a lot of
	// statistics and we can repport global token and sequence error rate as
	// well as precision recall and f-measure for each labels.
	if (mdl->opt->check) {
		const double te = (double)terr  / tcnt * 100.0;
		const double se = (double)serr  / scnt * 100.0;
		info("    Nb sequences  : %"PRIu64"\n", scnt);
		info("    Token error   : %5.2f%%\n", te);
		info("    Sequence error: %5.2f%%\n", se);
		info("* Per label statistics\n");
		for (uint32_t y = 0; y < Y; y++) {
			const char   *lbl = qrk_id2str(lbls, y);
			const double  Rc  = (double)stat[2][y] / stat[0][y];
			const double  Pr  = (double)stat[2][y] / stat[1][y];
			const double  F1  = 2.0 * (Pr * Rc) / (Pr + Rc);
			info("    %-6s", lbl);
			info("  Pr=%.2f", Pr);
			info("  Rc=%.2f", Rc);
			info("  F1=%.2f\n", F1);
		}
	}
    
    return 1;
}